

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllContentModel.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AllContentModel::buildChildList
          (AllContentModel *this,ContentSpecNode *curNode,
          ValueVectorOf<xercesc_4_0::QName_*> *toFill,ValueVectorOf<bool> *toOptional)

{
  QName *pQVar1;
  XMLSize_t XVar2;
  RuntimeException *this_00;
  int iVar3;
  ContentSpecNode *pCVar4;
  
LAB_002ed2aa:
  pCVar4 = curNode;
  switch(pCVar4->fType) {
  case Leaf:
    pQVar1 = pCVar4->fElement;
    ValueVectorOf<xercesc_4_0::QName_*>::ensureExtraCapacity(toFill,1);
    XVar2 = toFill->fCurCount;
    toFill->fCurCount = XVar2 + 1;
    toFill->fElemList[XVar2] = pQVar1;
    ValueVectorOf<bool>::ensureExtraCapacity(toOptional,1);
    XVar2 = toOptional->fCurCount;
    toOptional->fCurCount = XVar2 + 1;
    toOptional->fElemList[XVar2] = false;
    this->fNumRequired = this->fNumRequired + 1;
    return;
  case ZeroOrOne:
    if (pCVar4->fFirst->fType == Leaf) {
      pQVar1 = pCVar4->fFirst->fElement;
      ValueVectorOf<xercesc_4_0::QName_*>::ensureExtraCapacity(toFill,1);
      XVar2 = toFill->fCurCount;
      toFill->fCurCount = XVar2 + 1;
      toFill->fElemList[XVar2] = pQVar1;
      ValueVectorOf<bool>::ensureExtraCapacity(toOptional,1);
      XVar2 = toOptional->fCurCount;
      toOptional->fCurCount = XVar2 + 1;
      toOptional->fElemList[XVar2] = true;
      return;
    }
    this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/AllContentModel.cpp"
               ,0x158,CM_UnknownCMSpecType,this->fMemoryManager);
    goto LAB_002ed4aa;
  case ZeroOrMore:
    curNode = pCVar4->fFirst;
    if ((curNode != (ContentSpecNode *)0x0) && (curNode->fType == Loop)) goto LAB_002ed2aa;
    if (pCVar4->fType == Loop) goto switchD_002ed2c4_caseD_a;
    break;
  case All:
    goto switchD_002ed2c4_caseD_9;
  case Loop:
switchD_002ed2c4_caseD_a:
    if (0 < pCVar4->fMinOccurs) {
      iVar3 = 0;
      do {
        pQVar1 = pCVar4->fElement;
        ValueVectorOf<xercesc_4_0::QName_*>::ensureExtraCapacity(toFill,1);
        XVar2 = toFill->fCurCount;
        toFill->fCurCount = XVar2 + 1;
        toFill->fElemList[XVar2] = pQVar1;
        ValueVectorOf<bool>::ensureExtraCapacity(toOptional,1);
        XVar2 = toOptional->fCurCount;
        toOptional->fCurCount = XVar2 + 1;
        toOptional->fElemList[XVar2] = false;
        this->fNumRequired = this->fNumRequired + 1;
        iVar3 = iVar3 + 1;
      } while (iVar3 < pCVar4->fMinOccurs);
    }
    if ((pCVar4->fMaxOccurs != -1) && (pCVar4->fMinOccurs < pCVar4->fMaxOccurs)) {
      iVar3 = 0;
      do {
        pQVar1 = pCVar4->fElement;
        ValueVectorOf<xercesc_4_0::QName_*>::ensureExtraCapacity(toFill,1);
        XVar2 = toFill->fCurCount;
        toFill->fCurCount = XVar2 + 1;
        toFill->fElemList[XVar2] = pQVar1;
        ValueVectorOf<bool>::ensureExtraCapacity(toOptional,1);
        XVar2 = toOptional->fCurCount;
        toOptional->fCurCount = XVar2 + 1;
        toOptional->fElemList[XVar2] = true;
        iVar3 = iVar3 + 1;
      } while (iVar3 < pCVar4->fMaxOccurs - pCVar4->fMinOccurs);
    }
    return;
  }
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/AllContentModel.cpp"
             ,0x177,CM_UnknownCMSpecType,this->fMemoryManager);
LAB_002ed4aa:
  __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
switchD_002ed2c4_caseD_9:
  curNode = pCVar4->fSecond;
  buildChildList(this,pCVar4->fFirst,toFill,toOptional);
  if (curNode == (ContentSpecNode *)0x0) {
    return;
  }
  goto LAB_002ed2aa;
}

Assistant:

void
AllContentModel::buildChildList(ContentSpecNode* const       curNode
                              , ValueVectorOf<QName*>&       toFill
                              , ValueVectorOf<bool>&         toOptional)
{
    // Get the type of spec node our current node is
    const ContentSpecNode::NodeTypes curType = curNode->getType();

    if (curType == ContentSpecNode::All)
    {
        // Get both the child node pointers
        ContentSpecNode* leftNode = curNode->getFirst();
        ContentSpecNode* rightNode = curNode->getSecond();

        // Recurse on the left and right nodes
        buildChildList(leftNode, toFill, toOptional);
        if(rightNode)
            buildChildList(rightNode, toFill, toOptional);
    }
    else if (curType == ContentSpecNode::Leaf)
    {
        // At leaf, add the element to list of elements permitted in the all
        toFill.addElement(curNode->getElement());
        toOptional.addElement(false);
        fNumRequired++;
    }
    else if (curType == ContentSpecNode::ZeroOrOne)
    {
        // At ZERO_OR_ONE node, subtree must be an element
        // that was specified with minOccurs=0, maxOccurs=1
        ContentSpecNode* leftNode = curNode->getFirst();
        if (leftNode->getType() != ContentSpecNode::Leaf)
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, fMemoryManager);

        toFill.addElement(leftNode->getElement());
        toOptional.addElement(true);
    }
    // only allow ZeroOrMore when it's the father of a Loop
    else if (curType == ContentSpecNode::ZeroOrMore &&
             curNode->getFirst()!=0 &&
             curNode->getFirst()->getType()==ContentSpecNode::Loop)
    {
        ContentSpecNode* leftNode = curNode->getFirst();
        buildChildList(leftNode, toFill, toOptional);
    }
    else if (curType == ContentSpecNode::Loop)
    {
        // At leaf, add the element to list of elements permitted in the all
        int i;
        for(i=0;i<curNode->getMinOccurs();i++)
        {
            toFill.addElement(curNode->getElement());
            toOptional.addElement(false);
            fNumRequired++;
        }
        if(curNode->getMaxOccurs()!=-1)
            for(i=0;i<(curNode->getMaxOccurs() - curNode->getMinOccurs());i++)
            {
                toFill.addElement(curNode->getElement());
                toOptional.addElement(true);
            }
    }
    else
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, fMemoryManager);
}